

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setparamscheck(HSQUIRRELVM v,SQInteger nparamscheck,SQChar *typemask)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQUnsignedInteger SVar3;
  EVP_PKEY_CTX *src;
  longlong local_70;
  uint local_68;
  undefined1 local_58 [8];
  SQIntVec res;
  SQNativeClosure *nc;
  SQObject o;
  SQChar *typemask_local;
  SQInteger nparamscheck_local;
  HSQUIRRELVM v_local;
  
  pSVar2 = stack_get(v,-1);
  res._allocated = (SQUnsignedInteger)(pSVar2->super_SQObject)._unVal.pNativeClosure;
  nc._0_4_ = (int)*(undefined8 *)&pSVar2->super_SQObject;
  if ((int)nc == 0x8000200) {
    ((SQNativeClosure *)res._allocated)->_nparamscheck = nparamscheck;
    if (typemask == (SQChar *)0x0) {
      local_70 = 0;
      sqvector<long_long>::resize(&((SQNativeClosure *)res._allocated)->_typecheck,0,&local_70);
    }
    else {
      sqvector<long_long>::sqvector((sqvector<long_long> *)local_58);
      bVar1 = CompileTypemask((sqvector<long_long> *)local_58,typemask);
      if (bVar1) {
        sqvector<long_long>::copy
                  ((sqvector<long_long> *)(res._allocated + 0x38),(EVP_PKEY_CTX *)local_58,src);
      }
      else {
        v_local = (HSQUIRRELVM)sq_throwerror(v,"invalid typemask");
      }
      local_68 = (uint)!bVar1;
      sqvector<long_long>::~sqvector((sqvector<long_long> *)local_58);
      if (local_68 != 0) {
        return (SQRESULT)v_local;
      }
    }
    if (nparamscheck == -99999) {
      SVar3 = sqvector<long_long>::size((sqvector<long_long> *)(res._allocated + 0x38));
      *(SQUnsignedInteger *)(res._allocated + 0x30) = SVar3;
    }
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror(v,"native closure expected");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_setparamscheck(HSQUIRRELVM v,SQInteger nparamscheck,const SQChar *typemask)
{
    SQObject o = stack_get(v, -1);
    if(!sq_isnativeclosure(o))
        return sq_throwerror(v, _SC("native closure expected"));
    SQNativeClosure *nc = _nativeclosure(o);
    nc->_nparamscheck = nparamscheck;
    if(typemask) {
        SQIntVec res;
        if(!CompileTypemask(res, typemask))
            return sq_throwerror(v, _SC("invalid typemask"));
        nc->_typecheck.copy(res);
    }
    else {
        nc->_typecheck.resize(0);
    }
    if(nparamscheck == SQ_MATCHTYPEMASKSTRING) {
        nc->_nparamscheck = nc->_typecheck.size();
    }
    return SQ_OK;
}